

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

CURLcode ws_cw_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  Curl_cwriter *data_00;
  _Bool _Var1;
  size_t sVar2;
  Curl_cwriter *local_78;
  ws_cw_dec_ctx pass_ctx;
  ssize_t nwritten;
  Curl_easy *pCStack_48;
  CURLcode result;
  websocket *ws;
  ws_cw_ctx *ctx;
  size_t nbytes_local;
  char *buf_local;
  Curl_cwriter *pCStack_20;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  ws = (websocket *)writer->ctx;
  ctx = (ws_cw_ctx *)nbytes;
  nbytes_local = (size_t)buf;
  buf_local._4_4_ = type;
  pCStack_20 = writer;
  writer_local = (Curl_cwriter *)data;
  if (((type & 1U) == 0) || ((*(ulong *)&(data->set).field_0x89c >> 0x37 & 1) != 0)) {
    data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
  }
  else {
    pCStack_48 = (Curl_easy *)Curl_conn_meta_get(data->conn,"meta:proto:ws:conn");
    if (pCStack_48 == (Curl_easy *)0x0) {
      Curl_failf((Curl_easy *)writer_local,"WS: not a websocket transfer");
      data_local._4_4_ = CURLE_FAILED_INIT;
    }
    else if ((ctx == (ws_cw_ctx *)0x0) ||
            (pass_ctx._24_8_ =
                  Curl_bufq_write((bufq *)(ws->dec).head,(uchar *)nbytes_local,(size_t)ctx,
                                  (CURLcode *)((long)&nwritten + 4)), -1 < (long)pass_ctx._24_8_)) {
      while (_Var1 = Curl_bufq_is_empty((bufq *)(ws->dec).head), ((_Var1 ^ 0xffU) & 1) != 0) {
        local_78 = writer_local;
        pass_ctx.data = pCStack_48;
        pass_ctx.ws = (websocket *)pCStack_20->next;
        pass_ctx.next_writer._0_4_ = buf_local._4_4_;
        nwritten._4_4_ =
             ws_dec_pass((ws_decoder *)&pCStack_48->id,(Curl_easy *)writer_local,
                         (bufq *)(ws->dec).head,ws_cw_dec_next,&local_78);
        if (nwritten._4_4_ == CURLE_AGAIN) {
          if ((((writer_local != (Curl_cwriter *)0x0) &&
               ((*(ulong *)((long)&writer_local[0x51].next + 4) >> 0x1e & 1) != 0)) &&
              ((writer_local[0x98].ctx == (void *)0x0 ||
               (0 < *(int *)((long)writer_local[0x98].ctx + 8))))) &&
             (0 < Curl_trc_feat_write.log_level)) {
            Curl_trc_write((Curl_easy *)writer_local,"websocket, buffered incomplete frame head");
          }
          return CURLE_OK;
        }
        if (nwritten._4_4_ != CURLE_OK) {
          if (((writer_local != (Curl_cwriter *)0x0) &&
              ((*(ulong *)((long)&writer_local[0x51].next + 4) >> 0x1e & 1) != 0)) &&
             ((writer_local[0x98].ctx == (void *)0x0 ||
              (0 < *(int *)((long)writer_local[0x98].ctx + 8))))) {
            Curl_infof((Curl_easy *)writer_local,"WS: decode error %d",(ulong)nwritten._4_4_);
          }
          return nwritten._4_4_;
        }
        nwritten._4_4_ = CURLE_OK;
      }
      if (((buf_local._4_4_ & 0x80) == 0) ||
         (_Var1 = Curl_bufq_is_empty((bufq *)(ws->dec).head), data_00 = writer_local, _Var1)) {
        data_local._4_4_ = CURLE_OK;
      }
      else {
        if (((writer_local != (Curl_cwriter *)0x0) &&
            ((*(ulong *)((long)&writer_local[0x51].next + 4) >> 0x1e & 1) != 0)) &&
           ((writer_local[0x98].ctx == (void *)0x0 ||
            (0 < *(int *)((long)writer_local[0x98].ctx + 8))))) {
          sVar2 = Curl_bufq_len((bufq *)(ws->dec).head);
          Curl_infof((Curl_easy *)data_00,"WS: decode ending with %zd frame bytes remaining",sVar2);
        }
        data_local._4_4_ = CURLE_RECV_ERROR;
      }
    }
    else {
      if (((writer_local != (Curl_cwriter *)0x0) &&
          ((*(ulong *)((long)&writer_local[0x51].next + 4) >> 0x1e & 1) != 0)) &&
         ((writer_local[0x98].ctx == (void *)0x0 || (0 < *(int *)((long)writer_local[0x98].ctx + 8))
          ))) {
        Curl_infof((Curl_easy *)writer_local,"WS: error adding data to buffer %d",
                   (ulong)nwritten._4_4_);
      }
      data_local._4_4_ = nwritten._4_4_;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ws_cw_write(struct Curl_easy *data,
                            struct Curl_cwriter *writer, int type,
                            const char *buf, size_t nbytes)
{
  struct ws_cw_ctx *ctx = writer->ctx;
  struct websocket *ws;
  CURLcode result;

  if(!(type & CLIENTWRITE_BODY) || data->set.ws_raw_mode)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  ws = Curl_conn_meta_get(data->conn, CURL_META_PROTO_WS_CONN);
  if(!ws) {
    failf(data, "WS: not a websocket transfer");
    return CURLE_FAILED_INIT;
  }

  if(nbytes) {
    ssize_t nwritten;
    nwritten = Curl_bufq_write(&ctx->buf, (const unsigned char *)buf,
                               nbytes, &result);
    if(nwritten < 0) {
      infof(data, "WS: error adding data to buffer %d", result);
      return result;
    }
  }

  while(!Curl_bufq_is_empty(&ctx->buf)) {
    struct ws_cw_dec_ctx pass_ctx;
    pass_ctx.data = data;
    pass_ctx.ws = ws;
    pass_ctx.next_writer = writer->next;
    pass_ctx.cw_type = type;
    result = ws_dec_pass(&ws->dec, data, &ctx->buf,
                         ws_cw_dec_next, &pass_ctx);
    if(result == CURLE_AGAIN) {
      /* insufficient amount of data, keep it for later.
       * we pretend to have written all since we have a copy */
      CURL_TRC_WRITE(data, "websocket, buffered incomplete frame head");
      return CURLE_OK;
    }
    else if(result) {
      infof(data, "WS: decode error %d", (int)result);
      return result;
    }
  }

  if((type & CLIENTWRITE_EOS) && !Curl_bufq_is_empty(&ctx->buf)) {
    infof(data, "WS: decode ending with %zd frame bytes remaining",
          Curl_bufq_len(&ctx->buf));
    return CURLE_RECV_ERROR;
  }

  return CURLE_OK;
}